

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O0

void __thiscall
henson::Coroutine<henson::PythonPuppet>::Coroutine
          (Coroutine<henson::PythonPuppet> *this,string *name)

{
  BaseCoroutine *in_RDI;
  string *in_stack_ffffffffffffff98;
  string *name_00;
  allocator local_31;
  string local_30 [48];
  
  BaseCoroutine::BaseCoroutine(in_RDI,in_stack_ffffffffffffff98);
  name_00 = (string *)&in_RDI[1].running_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"henson",&local_31);
  spdlog::get(name_00);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  coro_stack_alloc(in_RDI + 1,0x800000);
  coro_create((undefined1 *)((long)&in_RDI[1].name_.field_2 + 8),PythonPuppet::exec,in_RDI,
              *(undefined8 *)&in_RDI[1].name_,in_RDI[1].name_._M_string_length);
  coro_create(&in_RDI[1].name_.field_2,0,0,0);
  return;
}

Assistant:

Coroutine(const std::string& name):
                            BaseCoroutine(name)
                        {
#ifdef USE_BOOST
                            to_ = bc::callcc([this](context_t&& from)
                                  {
                                      from_ = std::move(from);
                                      from_ = from_.resume();
                                      Derived::exec(this);
                                      return std::move(from_);
                                  });
#else
                            coro_stack_alloc(&stack_, 8*1024*1024);     // 8MB stack
                            coro_create(&to_, Derived::exec, this, stack_.sptr, stack_.ssze);
                            coro_create(&from_, NULL, NULL, NULL, 0);
#endif
                        }